

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatEntry.cpp
# Opt level: O2

string * __thiscall
FatEntry::getShortFilename_abi_cxx11_(string *__return_storage_ptr__,FatEntry *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string base;
  string ext;
  string local_50;
  string local_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::substr((ulong)&local_30,(ulong)this);
  trim(&ext,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::substr((ulong)&local_50,(ulong)this);
  trim(&base,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (*(this->shortName)._M_dataplus._M_p == -0x1b) {
    std::__cxx11::string::substr((ulong)&local_b0,(ulong)&base);
    std::__cxx11::string::operator=((string *)&base,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  bVar1 = std::operator!=(&ext,"");
  if (bVar1) {
    std::operator+(&local_b0,".",&ext);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  std::__cxx11::string::~string((string *)&base);
  std::__cxx11::string::~string((string *)&ext);
  return __return_storage_ptr__;
}

Assistant:

string FatEntry::getShortFilename()
{
    string name;
    string ext = trim(shortName.substr(8,3));
    string base = trim(shortName.substr(0,8));

    if (isErased()) {
        base = base.substr(1);
    }

    name = base;

    if (ext != "") {
        name += "." + ext;
    }

    return name;
}